

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ItemSimilarityRecommender_SimilarItems::SharedCtor
          (ItemSimilarityRecommender_SimilarItems *this)

{
  this->itemid_ = 0;
  this->itemscoreadjustment_ = 0.0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

void ItemSimilarityRecommender_SimilarItems::SharedCtor() {
  ::memset(&itemid_, 0, reinterpret_cast<char*>(&itemscoreadjustment_) -
    reinterpret_cast<char*>(&itemid_) + sizeof(itemscoreadjustment_));
  _cached_size_ = 0;
}